

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::kotlin::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Context *context)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ClassNameResolver *pCVar4;
  FileDescriptor *pFVar5;
  Options *pOVar6;
  FieldDescriptor *pFVar7;
  char *pcVar8;
  pointer ppVar9;
  LogMessage *pLVar10;
  int __c;
  byte local_e3;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> local_c0;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> local_a0;
  byte local_79;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LogMessageFatal local_68 [19];
  Voidify local_55;
  int local_54;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_50;
  OneofDescriptor *local_38;
  OneofDescriptor *oneof;
  int i;
  Context *local_20;
  Context *context_local;
  Descriptor *descriptor_local;
  MessageGenerator *this_local;
  
  this->_vptr_MessageGenerator = (_func_int **)&PTR__MessageGenerator_0084c810;
  this->context_ = context;
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (Descriptor *)this;
  pCVar4 = java::Context::GetNameResolver(context);
  this->name_resolver_ = pCVar4;
  this->descriptor_ = (Descriptor *)context_local;
  absl::lts_20240722::
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  ::btree_map(&this->oneofs_);
  pFVar5 = Descriptor::file(this->descriptor_);
  bVar2 = java::Context::EnforceLite(local_20);
  bVar2 = java::HasDescriptorMethods(pFVar5,bVar2);
  this->lite_ = (bool)((bVar2 ^ 0xffU) & 1);
  local_e3 = 1;
  if ((this->lite_ & 1U) != 0) {
    pOVar6 = java::Context::options(local_20);
    local_e3 = pOVar6->jvm_dsl;
  }
  this->jvm_dsl_ = (bool)(local_e3 & 1);
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->lite_field_generators_,this->descriptor_);
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
  FieldGeneratorMap(&this->field_generators_,this->descriptor_);
  oneof._0_4_ = 0;
  do {
    uVar1 = (uint)oneof;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= (int)uVar1) {
      if ((this->lite_ & 1U) == 0) {
        java::MakeImmutableFieldGenerators(&local_c0,this->descriptor_,this->context_);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        operator=(&this->field_generators_,&local_c0);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&local_c0);
      }
      else {
        java::MakeImmutableFieldLiteGenerators(&local_a0,this->descriptor_,this->context_);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        operator=(&this->lite_field_generators_,&local_a0);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap(&local_a0);
      }
      return;
    }
    pFVar7 = Descriptor::field(this->descriptor_,(uint)oneof);
    bVar2 = java::IsRealOneof(pFVar7);
    if (bVar2) {
      pcVar8 = (char *)(ulong)(uint)oneof;
      pFVar7 = Descriptor::field(this->descriptor_,(uint)oneof);
      local_38 = FieldDescriptor::containing_oneof(pFVar7);
      local_79 = 0;
      pcVar8 = OneofDescriptor::index(local_38,pcVar8,__c);
      local_54 = (int)pcVar8;
      absl::lts_20240722::container_internal::
      btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
      ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                (&local_50,&this->oneofs_,&local_54,&local_38);
      ppVar9 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator->(&local_50.first);
      if (ppVar9->second != local_38) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_78,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/kotlin/message.cc"
                   ,0x32,local_78._M_len,local_78._M_str);
        local_79 = 1;
        pLVar10 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_68);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_55,pLVar10);
      }
      if ((local_79 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
      }
    }
    oneof._0_4_ = (uint)oneof + 1;
  } while( true );
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   java::Context* context)
    : context_(context),
      name_resolver_(context->GetNameResolver()),
      descriptor_(descriptor),
      lite_(!java::HasDescriptorMethods(descriptor_->file(),
                                        context->EnforceLite())),
      jvm_dsl_(!lite_ || context->options().jvm_dsl),
      lite_field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldLiteGenerator>(
              descriptor_)),
      field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldGenerator>(descriptor_)) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (java::IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
  if (lite_) {
    lite_field_generators_ =
        java::MakeImmutableFieldLiteGenerators(descriptor_, context_);
  } else {
    field_generators_ =
        java::MakeImmutableFieldGenerators(descriptor_, context_);
  }
}